

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O3

void __thiscall
SBarInfoCommandFlowControl::ParseBlock
          (SBarInfoCommandFlowControl *this,
          TDeletingArray<SBarInfoCommand_*,_SBarInfoCommand_*> *commands,FScanner *sc,
          bool fullScreenOffsets)

{
  uint uVar1;
  bool bVar2;
  SBarInfoCommand *pSVar3;
  
  bVar2 = FScanner::CheckToken(sc,0x7b);
  pSVar3 = NextCommand(this,sc);
  if (bVar2) {
    if (pSVar3 != (SBarInfoCommand *)0x0) {
      do {
        (*pSVar3->_vptr_SBarInfoCommand[3])(pSVar3,sc,(ulong)fullScreenOffsets);
        TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::Grow
                  (&commands->super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>,1);
        uVar1 = (commands->super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>).Count;
        (commands->super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>).Array[uVar1] = pSVar3;
        (commands->super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>).Count = uVar1 + 1;
        pSVar3 = NextCommand(this,sc);
      } while (pSVar3 != (SBarInfoCommand *)0x0);
    }
  }
  else {
    if (pSVar3 == (SBarInfoCommand *)0x0) {
      FScanner::ScriptError(sc,"Missing command for flow control statement.");
      return;
    }
    (*pSVar3->_vptr_SBarInfoCommand[3])(pSVar3,sc,(ulong)fullScreenOffsets);
    TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::Grow
              (&commands->super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>,1);
    uVar1 = (commands->super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>).Count;
    (commands->super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>).Array[uVar1] = pSVar3;
    (commands->super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>).Count = uVar1 + 1;
  }
  return;
}

Assistant:

void ParseBlock(TDeletingArray<SBarInfoCommand *> &commands, FScanner &sc, bool fullScreenOffsets)
		{
			if(sc.CheckToken('{'))
			{
				while(SBarInfoCommand *cmd = NextCommand(sc))
				{
					cmd->Parse(sc, fullScreenOffsets);
					commands.Push(cmd);
				}
			}
			else
			{
				if(SBarInfoCommand *cmd = NextCommand(sc))
				{
					cmd->Parse(sc, fullScreenOffsets);
					commands.Push(cmd);
				}
				else
					sc.ScriptError("Missing command for flow control statement.");
			}
		}